

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DXFLoader.cpp
# Opt level: O1

void __thiscall
Assimp::DXFImporter::InternReadFile
          (DXFImporter *this,string *filename,aiScene *pScene,IOSystem *pIOHandler)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  aiNode *paVar17;
  int iVar18;
  int iVar19;
  undefined4 extraout_var;
  Logger *pLVar20;
  long *plVar21;
  runtime_error *prVar22;
  long *plVar23;
  FileData *extraout_RDX;
  char *pcVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  float fVar29;
  float fVar30;
  float fVar31;
  float fVar32;
  float fVar33;
  float fVar34;
  float fVar35;
  float fVar36;
  float fVar37;
  float fVar38;
  float fVar39;
  float fVar40;
  float fVar41;
  float fVar42;
  float fVar43;
  float fVar44;
  shared_ptr<Assimp::IOStream> file;
  FileData output;
  LineReader reader;
  char buff [25];
  StreamReaderLE stream;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_2c0;
  shared_ptr<Assimp::IOStream> local_2b8;
  FileData local_2a8;
  char *local_290;
  char local_280 [16];
  LineReader local_270;
  char local_208 [40];
  StreamReader<false,_false> local_1e0;
  long *local_1a8;
  long local_1a0;
  long local_198;
  long lStack_190;
  ios_base local_138 [264];
  IOStream *__p;
  
  local_1a8 = &local_198;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1a8,"rb","");
  iVar18 = (*pIOHandler->_vptr_IOSystem[4])(pIOHandler,(filename->_M_dataplus)._M_p,local_1a8);
  __p = (IOStream *)CONCAT44(extraout_var,iVar18);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<Assimp::IOStream*>(&local_2c0,__p)
  ;
  if (local_1a8 != &local_198) {
    operator_delete(local_1a8);
  }
  if (__p == (IOStream *)0x0) {
    prVar22 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_270,
                   "Failed to open DXF file ",filename);
    plVar21 = (long *)std::__cxx11::string::append((char *)&local_270);
    local_1a8 = (long *)*plVar21;
    plVar23 = plVar21 + 2;
    if (local_1a8 == plVar23) {
      local_198 = *plVar23;
      lStack_190 = plVar21[3];
      local_1a8 = &local_198;
    }
    else {
      local_198 = *plVar23;
    }
    local_1a0 = plVar21[1];
    *plVar21 = (long)plVar23;
    plVar21[1] = 0;
    *(undefined1 *)(plVar21 + 2) = 0;
    std::runtime_error::runtime_error(prVar22,(string *)&local_1a8);
    *(undefined ***)prVar22 = &PTR__runtime_error_00896c98;
    __cxa_throw(prVar22,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
  }
  local_208[0x10] = 0;
  local_208[0x11] = '\0';
  local_208[0x12] = '\0';
  local_208[0x13] = '\0';
  local_208[0x14] = '\0';
  local_208[0x15] = '\0';
  local_208[0x16] = '\0';
  local_208[0x17] = '\0';
  local_208[0x18] = '\0';
  local_208[0] = '\0';
  local_208[1] = '\0';
  local_208[2] = '\0';
  local_208[3] = '\0';
  local_208[4] = '\0';
  local_208[5] = '\0';
  local_208[6] = '\0';
  local_208[7] = '\0';
  local_208[8] = 0;
  local_208[9] = '\0';
  local_208[10] = '\0';
  local_208[0xb] = '\0';
  local_208[0xc] = '\0';
  local_208[0xd] = '\0';
  local_208[0xe] = '\0';
  local_208[0xf] = '\0';
  (*__p->_vptr_IOStream[2])(__p,local_208,0x18,1);
  iVar18 = strncmp(AI_DXF_BINARY_IDENT_abi_cxx11_._M_dataplus._M_p,local_208,0x18);
  if (iVar18 == 0) {
    prVar22 = (runtime_error *)__cxa_allocate_exception(0x10);
    local_1a8 = &local_198;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_1a8,"DXF: Binary files are not supported at the moment","");
    std::runtime_error::runtime_error(prVar22,(string *)&local_1a8);
    *(undefined ***)prVar22 = &PTR__runtime_error_00896c98;
    __cxa_throw(prVar22,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
  }
  (*__p->_vptr_IOStream[4])(__p,0,0);
  local_2b8.super___shared_ptr<Assimp::IOStream,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       local_2c0._M_pi;
  if (local_2c0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_2c0._M_pi)->_M_use_count = (local_2c0._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_2c0._M_pi)->_M_use_count = (local_2c0._M_pi)->_M_use_count + 1;
    }
  }
  local_2b8.super___shared_ptr<Assimp::IOStream,_(__gnu_cxx::_Lock_policy)2>._M_ptr = __p;
  StreamReader<false,_false>::StreamReader(&local_1e0,&local_2b8,false);
  if (local_2b8.super___shared_ptr<Assimp::IOStream,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_2b8.super___shared_ptr<Assimp::IOStream,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  DXF::LineReader::LineReader(&local_270,&local_1e0);
  local_2a8.blocks.super__Vector_base<Assimp::DXF::Block,_std::allocator<Assimp::DXF::Block>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_2a8.blocks.super__Vector_base<Assimp::DXF::Block,_std::allocator<Assimp::DXF::Block>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_2a8.blocks.super__Vector_base<Assimp::DXF::Block,_std::allocator<Assimp::DXF::Block>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (local_270.end < 2) {
    do {
      iVar18 = local_270.groupcode;
      if (local_270.groupcode == 2) {
        iVar19 = strcmp("BLOCKS",local_270.value._M_dataplus._M_p);
        if (iVar19 == 0) {
          ParseBlocks(this,&local_270,&local_2a8);
        }
        else {
          iVar19 = strcmp("ENTITIES",local_270.value._M_dataplus._M_p);
          if (iVar19 == 0) {
            ParseEntities(this,&local_270,&local_2a8);
          }
          else {
            pcVar24 = "CLASSES";
            iVar19 = strcmp("CLASSES",local_270.value._M_dataplus._M_p);
            if (iVar19 != 0) {
              pcVar24 = "TABLES";
              iVar19 = strcmp("TABLES",local_270.value._M_dataplus._M_p);
              if (iVar19 != 0) {
                pcVar24 = "HEADER";
                iVar19 = strcmp("HEADER",local_270.value._M_dataplus._M_p);
                if (iVar19 != 0) goto LAB_0042d244;
                ParseHeader((DXFImporter *)pcVar24,&local_270,extraout_RDX);
                goto LAB_0042d32b;
              }
            }
            SkipSection((DXFImporter *)pcVar24,&local_270);
          }
        }
      }
      else {
LAB_0042d244:
        if (iVar18 == 0) {
          iVar18 = strcmp("EOF",local_270.value._M_dataplus._M_p);
          if (iVar18 == 0) goto LAB_0042cdf3;
        }
        else if (iVar18 == 999) {
          pLVar20 = DefaultLogger::get();
          Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::
          basic_formatter<char[14]>
                    ((basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &local_1a8,(char (*) [14])"DXF Comment: ");
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&local_1a8,local_270.value._M_dataplus._M_p,
                     local_270.value._M_string_length);
          std::__cxx11::stringbuf::str();
          Logger::info(pLVar20,local_290);
          if (local_290 != local_280) {
            operator_delete(local_290);
          }
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1a8);
          std::ios_base::~ios_base(local_138);
        }
        DXF::LineReader::operator++(&local_270);
      }
LAB_0042d32b:
    } while (local_270.end < 2);
  }
  pLVar20 = DefaultLogger::get();
  Logger::warn(pLVar20,"DXF: EOF reached, but did not encounter DXF EOF marker");
LAB_0042cdf3:
  ConvertMeshes(this,pScene,&local_2a8);
  paVar17 = pScene->mRootNode;
  fVar1 = (paVar17->mTransformation).b1;
  fVar25 = fVar1 * 0.0;
  fVar2 = (paVar17->mTransformation).a1;
  fVar3 = (paVar17->mTransformation).a2;
  fVar4 = (paVar17->mTransformation).c1;
  fVar34 = fVar4 * 0.0;
  fVar5 = (paVar17->mTransformation).d1;
  fVar28 = fVar2 * 0.0;
  fVar26 = fVar25 + fVar28;
  fVar37 = fVar5 * 0.0;
  fVar6 = (paVar17->mTransformation).b2;
  fVar38 = fVar6 * 0.0;
  fVar7 = (paVar17->mTransformation).c2;
  fVar30 = fVar7 * 0.0;
  fVar8 = (paVar17->mTransformation).d2;
  fVar27 = fVar3 * 0.0;
  fVar39 = fVar38 + fVar27;
  fVar35 = fVar8 * 0.0;
  fVar9 = (paVar17->mTransformation).b3;
  fVar41 = fVar9 * 0.0;
  fVar10 = (paVar17->mTransformation).a3;
  fVar11 = (paVar17->mTransformation).c3;
  fVar44 = fVar11 * 0.0;
  fVar43 = fVar10 * 0.0;
  fVar42 = fVar41 + fVar43;
  fVar12 = (paVar17->mTransformation).d3;
  fVar40 = fVar12 * 0.0;
  fVar13 = (paVar17->mTransformation).b4;
  fVar31 = fVar13 * 0.0;
  fVar14 = (paVar17->mTransformation).a4;
  fVar15 = (paVar17->mTransformation).c4;
  fVar36 = fVar15 * 0.0;
  fVar29 = fVar14 * 0.0;
  fVar32 = fVar31 + fVar29;
  fVar16 = (paVar17->mTransformation).d4;
  fVar33 = fVar16 * 0.0;
  (paVar17->mTransformation).a1 = fVar2 + fVar25 + fVar34 + fVar37;
  (paVar17->mTransformation).a2 = fVar3 + fVar38 + fVar30 + fVar35;
  (paVar17->mTransformation).a3 = fVar10 + fVar41 + fVar44 + fVar40;
  (paVar17->mTransformation).a4 = fVar14 + fVar31 + fVar36 + fVar33;
  (paVar17->mTransformation).b1 = fVar4 + fVar26 + fVar37;
  (paVar17->mTransformation).b2 = fVar7 + fVar39 + fVar35;
  (paVar17->mTransformation).b3 = fVar11 + fVar42 + fVar40;
  (paVar17->mTransformation).b4 = fVar15 + fVar32 + fVar33;
  (paVar17->mTransformation).c1 = (fVar28 - fVar1) + fVar34 + fVar37;
  (paVar17->mTransformation).c2 = (fVar27 - fVar6) + fVar30 + fVar35;
  (paVar17->mTransformation).c3 = (fVar43 - fVar9) + fVar44 + fVar40;
  (paVar17->mTransformation).c4 = (fVar29 - fVar13) + fVar36 + fVar33;
  (paVar17->mTransformation).d1 = fVar26 + fVar34 + fVar5;
  (paVar17->mTransformation).d2 = fVar39 + fVar30 + fVar8;
  (paVar17->mTransformation).d3 = fVar42 + fVar44 + fVar12;
  (paVar17->mTransformation).d4 = fVar32 + fVar36 + fVar16;
  std::vector<Assimp::DXF::Block,_std::allocator<Assimp::DXF::Block>_>::~vector(&local_2a8.blocks);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_270.value._M_dataplus._M_p != &local_270.value.field_2) {
    operator_delete(local_270.value._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_270.splitter.mCur._M_dataplus._M_p != &local_270.splitter.mCur.field_2) {
    operator_delete(local_270.splitter.mCur._M_dataplus._M_p);
  }
  StreamReader<false,_false>::~StreamReader(&local_1e0);
  if (local_2c0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_2c0._M_pi);
  }
  return;
}

Assistant:

void DXFImporter::InternReadFile( const std::string& filename, aiScene* pScene, IOSystem* pIOHandler) {
    std::shared_ptr<IOStream> file = std::shared_ptr<IOStream>( pIOHandler->Open( filename) );

    // Check whether we can read the file
    if( file.get() == nullptr ) {
        throw DeadlyImportError( "Failed to open DXF file " + filename + "");
    }

    // Check whether this is a binary DXF file - we can't read binary DXF files :-(
    char buff[AI_DXF_BINARY_IDENT_LEN+1] = {0};
    file->Read(buff,AI_DXF_BINARY_IDENT_LEN,1);

    if (0 == strncmp(AI_DXF_BINARY_IDENT.c_str(),buff,AI_DXF_BINARY_IDENT_LEN)) {
        throw DeadlyImportError("DXF: Binary files are not supported at the moment");
    }

    // DXF files can grow very large, so read them via the StreamReader,
    // which will choose a suitable strategy.
    file->Seek(0,aiOrigin_SET);
    StreamReaderLE stream( file );

    DXF::LineReader reader (stream);
    DXF::FileData output;

    // now get all lines of the file and process top-level sections
    bool eof = false;
    while(!reader.End()) {

        // blocks table - these 'build blocks' are later (in ENTITIES)
        // referenced an included via INSERT statements.
        if (reader.Is(2,"BLOCKS")) {
            ParseBlocks(reader,output);
            continue;
        }

        // primary entity table
        if (reader.Is(2,"ENTITIES")) {
            ParseEntities(reader,output);
            continue;
        }

        // skip unneeded sections entirely to avoid any problems with them
        // altogether.
        else if (reader.Is(2,"CLASSES") || reader.Is(2,"TABLES")) {
            SkipSection(reader);
            continue;
        }

        else if (reader.Is(2,"HEADER")) {
            ParseHeader(reader,output);
            continue;
        }

        // comments
        else if (reader.Is(999)) {
            ASSIMP_LOG_INFO_F("DXF Comment: ", reader.Value());
        }

        // don't read past the official EOF sign
        else if (reader.Is(0,"EOF")) {
            eof = true;
            break;
        }

        ++reader;
    }
    if (!eof) {
        ASSIMP_LOG_WARN("DXF: EOF reached, but did not encounter DXF EOF marker");
    }

    ConvertMeshes(pScene,output);

    // Now rotate the whole scene by 90 degrees around the x axis to convert from AutoCAD's to Assimp's coordinate system
    pScene->mRootNode->mTransformation = aiMatrix4x4(
        1.f,0.f,0.f,0.f,
        0.f,0.f,1.f,0.f,
        0.f,-1.f,0.f,0.f,
        0.f,0.f,0.f,1.f) * pScene->mRootNode->mTransformation;
}